

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void escaped(tgestate_t *state)

{
  uint8_t uVar1;
  escapeitem_t eVar2;
  escapeitem_t eVar3;
  screenlocstring_t *psVar4;
  uint uVar5;
  uint8_t area;
  undefined8 uVar6;
  bool bVar7;
  
  screen_reset(state);
  psVar4 = screenlocstring_plot(state,escaped::messages);
  psVar4 = screenlocstring_plot(state,psVar4);
  screenlocstring_plot(state,psVar4);
  eVar2 = item_to_escapeitem(state->items_held[0]);
  eVar3 = item_to_escapeitem(state->items_held[1]);
  uVar5 = eVar3 | eVar2;
  if (uVar5 == 3) {
    bVar7 = false;
  }
  else if (uVar5 == 5) {
    psVar4 = screenlocstring_plot(state,escaped::messages + 3);
    screenlocstring_plot(state,psVar4);
    bVar7 = true;
  }
  else {
    psVar4 = screenlocstring_plot(state,escaped::messages + 5);
    if (uVar5 < 8) {
      if (uVar5 == 0) {
        psVar4 = escaped::messages + 7;
      }
      else {
        psVar4 = (screenlocstring_t *)
                 ((long)&escaped::messages[8].screenloc + (ulong)((uVar5 & 1) << 4));
      }
    }
    screenlocstring_plot(state,psVar4);
    bVar7 = 7 < uVar5;
  }
  uVar6 = 0;
  screenlocstring_plot(state,escaped::messages + 10);
  do {
    uVar1 = keyscan_all(state);
  } while (uVar1 != '\0');
  do {
    uVar1 = keyscan_all(state);
    area = (uint8_t)uVar6;
  } while (uVar1 == '\0');
  if (!bVar7) {
    solitary(state);
    return;
  }
  reset_game(state);
  if ((char)area < '\0') {
    return;
  }
  if (state->room_index != '\0') {
    return;
  }
  within_camp_bounds(area,&state->hero_mappos);
  return;
}

Assistant:

void escaped(tgestate_t *state)
{
  /**
   * $A5CE: Escape messages.
   */
  static const screenlocstring_t messages[11] =
  {
    { 0x006E,  9, "WELL DONE"             },
    { 0x00AA, 16, "YOU HAVE ESCAPED"      },
    { 0x00CC, 13, "FROM THE CAMP"         },
    { 0x0809, 18, "AND WILL CROSS THE"    },
    { 0x0829, 19, "BORDER SUCCESSFULLY"   },
    { 0x0809, 19, "BUT WERE RECAPTURED"   },
    { 0x082A, 17, "AND SHOT AS A SPY"     },
    { 0x0829, 18, "TOTALLY UNPREPARED"    },
    { 0x082C, 12, "TOTALLY LOST"          },
    { 0x0828, 21, "DUE TO LACK OF PAPERS" },
    { 0x100D, 13, "PRESS ANY KEY"         },
  };

  const screenlocstring_t *message;   /* was HL */
  escapeitem_t             itemflags; /* was C */
  uint8_t                  keys;      /* was A */

  assert(state != NULL);

  screen_reset(state);

  /* Print standard prefix messages. */
  message = &messages[0];
  message = screenlocstring_plot(state, message); /* WELL DONE */
  message = screenlocstring_plot(state, message); /* YOU HAVE ESCAPED */
  (void) screenlocstring_plot(state, message);    /* FROM THE CAMP */

  /* Form escape items bitfield. */
  itemflags = item_to_escapeitem(state->items_held[0]) |
              item_to_escapeitem(state->items_held[1]);

  /*         Items                     Message
   *    Unf Pur Ppr Cmp                -------
   *    ---+---+---+---
   *  0  .   .   .   .  "BUT WERE RECAPTURED TOTALLY UNPREPARED" (lose)
   *  1  .   .   .   X  "BUT WERE RECAPTURED DUE TO LACK OF PAPERS" (lose)
   *  2  .   .   X   .  "BUT WERE RECAPTURED TOTALLY LOST" (lose)
   *  3  .   .   X   X  (the game offers no extra message) (win)
   *  4  .   X   .   .  "BUT WERE RECAPTURED TOTALLY LOST" (lose)
   *  5  .   X   .   X  "AND WILL CROSS THE BORDER SUCCESSFULLY" (win)
   *  6  .   X   X   .  "BUT WERE RECAPTURED TOTALLY LOST" (lose)
   *  8  X   .   .   .  "BUT WERE RECAPTURED AND SHOT AS A SPY" (lose)
   *  9  X   .   .   X  "BUT WERE RECAPTURED AND SHOT AS A SPY" (lose)
   * 10  X   .   X   .  "BUT WERE RECAPTURED AND SHOT AS A SPY" (lose)
   * 12  X   X   .   .  "BUT WERE RECAPTURED AND SHOT AS A SPY" (lose)
   */

  /* Print item-tailored messages. */
  if (itemflags == (escapeitem_COMPASS | escapeitem_PURSE))
  {
    message = &messages[3];
    message = screenlocstring_plot(state, message); /* AND WILL CROSS THE */
    (void) screenlocstring_plot(state, message);    /* BORDER SUCCESSFULLY */

    itemflags = 0xFF; /* success - reset game */
  }
  else if (itemflags != (escapeitem_COMPASS | escapeitem_PAPERS))
  {
    message = &messages[5]; /* BUT WERE RECAPTURED */
    message = screenlocstring_plot(state, message);

    /* Have uniform => AND SHOT AS A SPY. */

    if (itemflags < escapeitem_UNIFORM)
    {
      /* No items => TOTALLY UNPREPARED. */
      message = &messages[7];
      if (itemflags)
      {
        /* No compass => TOTALLY LOST. */
        message = &messages[8];
        if (itemflags & escapeitem_COMPASS)
        {
          /* No papers => DUE TO LACK OF PAPERS. */
          message = &messages[9];
        }
      }
    }
    (void) screenlocstring_plot(state, message);
  }

  message = &messages[10]; /* PRESS ANY KEY */
  (void) screenlocstring_plot(state, message);

  /* Debounce: First wait for any already-held key to be released. */
  do
    keys = keyscan_all(state);
  while (keys != 0); /* Down press */
  /* Then wait for any key to be pressed. */
  do
    keys = keyscan_all(state);
  while (keys == 0); /* Up press */

  /* Reset the game, or send the hero to solitary. */
  if (itemflags == 0xFF || itemflags >= escapeitem_UNIFORM)
    reset_game(state); /* was tail call */
  else
    solitary(state); /* was tail call */
}